

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bra.c
# Opt level: O2

SizeT SPARC_Convert(Byte *data,SizeT size,UInt32 ip,int encoding)

{
  uint uVar1;
  byte bVar2;
  ulong uVar3;
  int iVar4;
  byte bVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  
  if (size < 4) {
    return 0;
  }
  iVar4 = -ip;
  uVar7 = 0;
  do {
    uVar3 = uVar7 & 0xffffffff;
    if (size - 4 < uVar3) {
      return uVar3;
    }
    bVar2 = data[uVar3];
    if (bVar2 == 0x7f) {
      bVar5 = data[uVar7 + 1];
      if (0xbf < bVar5) {
        uVar8 = uVar7 + 1;
        goto LAB_0059d6fc;
      }
    }
    else if ((bVar2 == 0x40) && (bVar5 = data[uVar7 + 1], bVar5 < 0x40)) {
      uVar8 = (ulong)((uint)uVar7 | 1);
LAB_0059d6fc:
      iVar9 = ip + (uint)uVar7;
      if (encoding == 0) {
        iVar9 = iVar4;
      }
      uVar1 = iVar9 + ((uint)data[uVar7 + 3] |
                      (uint)data[uVar7 + 2] << 8 | (uint)bVar5 << 0x10 | (uint)bVar2 << 0x18) * 4;
      uVar6 = (int)(uVar1 * 0x80) >> 9 & 0x3fc00000;
      data[uVar3] = (byte)(uVar6 >> 0x18) | 0x40;
      data[uVar8] = (byte)((uVar1 >> 2) >> 0x10) & 0x3f | (byte)(uVar6 >> 0x10);
      data[uVar7 + 2] = (Byte)(uVar1 >> 10);
      data[uVar7 + 3] = (Byte)(uVar1 >> 2);
    }
    uVar7 = uVar7 + 4;
    iVar4 = iVar4 + -4;
  } while( true );
}

Assistant:

SizeT SPARC_Convert(Byte *data, SizeT size, UInt32 ip, int encoding)
{
  UInt32 i;
  if (size < 4)
    return 0;
  size -= 4;
  for (i = 0; i <= size; i += 4)
  {
    if ((data[i] == 0x40 && (data[i + 1] & 0xC0) == 0x00) ||
        (data[i] == 0x7F && (data[i + 1] & 0xC0) == 0xC0))
    {
      UInt32 src =
        ((UInt32)data[i + 0] << 24) |
        ((UInt32)data[i + 1] << 16) |
        ((UInt32)data[i + 2] << 8) |
        ((UInt32)data[i + 3]);
      UInt32 dest;
      
      src <<= 2;
      if (encoding)
        dest = ip + i + src;
      else
        dest = src - (ip + i);
      dest >>= 2;
      
      dest = (((0 - ((dest >> 22) & 1)) << 22) & 0x3FFFFFFF) | (dest & 0x3FFFFF) | 0x40000000;

      data[i + 0] = (Byte)(dest >> 24);
      data[i + 1] = (Byte)(dest >> 16);
      data[i + 2] = (Byte)(dest >> 8);
      data[i + 3] = (Byte)dest;
    }
  }
  return i;
}